

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

char * __thiscall
cmLocalGenerator::GetFeature(cmLocalGenerator *this,string *feature,string *config)

{
  bool bVar1;
  ulong uVar2;
  cmStateSnapshot local_e0;
  undefined4 local_c4;
  cmStateDirectory local_c0;
  cmLocalGenerator *local_98;
  char *value;
  cmStateSnapshot snp;
  undefined1 local_48 [8];
  string featureName;
  string *config_local;
  string *feature_local;
  cmLocalGenerator *this_local;
  
  featureName.field_2._8_8_ = config;
  std::__cxx11::string::string((string *)local_48,(string *)feature);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)local_48,"_");
    cmsys::SystemTools::UpperCase
              ((string *)&snp.Position.Position,(string *)featureName.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_48,(string *)&snp.Position.Position);
    std::__cxx11::string::~string((string *)&snp.Position.Position);
  }
  value = (char *)(this->StateSnapshot).State;
  snp.State = (cmState *)(this->StateSnapshot).Position.Tree;
  snp.Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(this->StateSnapshot).Position.Position;
  while (bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)&value), bVar1) {
    cmStateSnapshot::GetDirectory(&local_c0,(cmStateSnapshot *)&value);
    local_98 = (cmLocalGenerator *)cmStateDirectory::GetProperty(&local_c0,(string *)local_48);
    this_local = local_98;
    if (local_98 != (cmLocalGenerator *)0x0) goto LAB_0078fbd4;
    cmStateSnapshot::GetBuildsystemDirectoryParent(&local_e0,(cmStateSnapshot *)&value);
    value = (char *)local_e0.State;
    snp.State = (cmState *)local_e0.Position.Tree;
    snp.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_e0.Position.Position;
  }
  this_local = (cmLocalGenerator *)0x0;
LAB_0078fbd4:
  local_c4 = 1;
  std::__cxx11::string::~string((string *)local_48);
  return (char *)this_local;
}

Assistant:

const char* cmLocalGenerator::GetFeature(const std::string& feature,
                                         const std::string& config)
{
  std::string featureName = feature;
  // TODO: Define accumulation policy for features (prepend, append, replace).
  // Currently we always replace.
  if (!config.empty()) {
    featureName += "_";
    featureName += cmSystemTools::UpperCase(config);
  }
  cmStateSnapshot snp = this->StateSnapshot;
  while (snp.IsValid()) {
    if (const char* value = snp.GetDirectory().GetProperty(featureName)) {
      return value;
    }
    snp = snp.GetBuildsystemDirectoryParent();
  }
  return CM_NULLPTR;
}